

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdFetchRex2(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  uint uVar1;
  byte bVar2;
  NDSTATUS NVar3;
  ulong uVar4;
  
  NVar3 = 0;
  if (((*(uint *)Instrux & 3) == 2) && (NVar3 = 0, (Instrux->FeatMode & 0x10) != 0)) {
    uVar4 = (ulong)Offset;
    NVar3 = 0x80000001;
    if (uVar4 + 2 <= Size) {
      uVar1 = *(uint *)&Instrux->field_0x5;
      *(uint *)&Instrux->field_0x5 = uVar1 | 2;
      *(uint *)Instrux = *(uint *)Instrux & 0xfff0fffe;
      (Instrux->field_73).Rex = *(ND_REX *)(Code + uVar4);
      bVar2 = Code[uVar4 + 1];
      *(byte *)((long)&Instrux->field_73 + 1) = bVar2;
      NVar3 = 0x80000004;
      if ((uVar1 & 1) == 0) {
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)(byte)(bVar2 & 0x20 | bVar2 >> 1 & 2 | bVar2 >> 2 & 0x10 |
                                     bVar2 * '\x02' & 4 | bVar2 * '\b' & 8 | bVar2 * '\x04' & 0x40 |
                                    bVar2 >> 3 & 1) | (uint)Instrux->Exs & 0xffffff80);
        bVar2 = Instrux->Length + 2;
        Instrux->Length = bVar2;
        NVar3 = 0x80000003;
        if (bVar2 < 0x10) {
          NVar3 = 0;
        }
      }
    }
  }
  return NVar3;
}

Assistant:

static NDSTATUS
NdFetchRex2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    if (ND_CODE_64 != Instrux->DefCode)
    {
        // AAD instruction outside 64-bit mode.
        return ND_STATUS_SUCCESS;
    }

    if (!(Instrux->FeatMode & ND_FEAT_APX))
    {
        // APX not enabled, #UD.
        return ND_STATUS_SUCCESS;
    }

    // One more byte has to follow.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    // This is REX2.
    Instrux->HasRex2 = ND_TRUE;
    Instrux->EncMode = ND_ENCM_LEGACY;
    Instrux->Rex2.Rex2[0] = Code[Offset + 0];
    Instrux->Rex2.Rex2[1] = Code[Offset + 1];

    // REX illegal with REX2.
    if (Instrux->HasRex)
    {
        return ND_STATUS_INVALID_PREFIX_SEQUENCE;
    }

    // Fill in the generic extension bits
    Instrux->Exs.r = Instrux->Rex2.r3;
    Instrux->Exs.rp = Instrux->Rex2.r4;
    Instrux->Exs.x = Instrux->Rex2.x3;
    Instrux->Exs.x4 = Instrux->Rex2.x4;
    Instrux->Exs.b = Instrux->Rex2.b3;
    Instrux->Exs.b4 = Instrux->Rex2.b4;
    Instrux->Exs.w = Instrux->Rex2.w;

    // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
    Instrux->Length += 2;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}